

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<phmap::btree_set<int,std::greater<int>,std::allocator<int>>,void>
               (btree_set<int,_std::greater<int>,_std::allocator<int>_> *container,ostream *os)

{
  bool bVar1;
  reference value;
  const_iterator cVar2;
  int *elem;
  undefined1 local_60 [8];
  const_iterator __end0;
  undefined1 local_40 [8];
  const_iterator __begin0;
  btree_set<int,_std::greater<int>,_std::allocator<int>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  btree_set<int,_std::greater<int>,_std::allocator<int>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (btree_set<int,_std::greater<int>,_std::allocator<int>_> *)0x0;
  __begin0._8_8_ = container;
  cVar2 = phmap::priv::
          btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
          ::begin((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
                   *)container);
  __end0._8_8_ = cVar2.node;
  __begin0.node._0_4_ = cVar2.position;
  local_40 = (undefined1  [8])__end0._8_8_;
  cVar2 = phmap::priv::
          btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
          ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
                 *)__begin0._8_8_);
  local_60 = (undefined1  [8])cVar2.node;
  __end0.node._0_4_ = cVar2.position;
  do {
    bVar1 = phmap::priv::
            btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
            ::operator!=((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                          *)local_40,(const_iterator *)local_60);
    if (!bVar1) {
LAB_0043ebd7:
      if (__range3 != (btree_set<int,_std::greater<int>,_std::allocator<int>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = phmap::priv::
            btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
            ::operator*((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                         *)local_40);
    if ((__range3 != (btree_set<int,_std::greater<int>,_std::allocator<int>_> *)0x0) &&
       (std::operator<<(os,','),
       __range3 == (btree_set<int,_std::greater<int>,_std::allocator<int>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_0043ebd7;
    }
    std::operator<<(os,' ');
    UniversalPrint<int>(value,os);
    __range3 = (btree_set<int,_std::greater<int>,_std::allocator<int>_> *)
               ((long)&(__range3->
                       super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
                       ).
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
                       .tree_.root_.
                       super__Tuple_impl<0UL,_std::greater<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
               + 1);
    phmap::priv::
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
    ::operator++((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                  *)local_40);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }